

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MilStorage.cpp
# Opt level: O2

u_int64_t __thiscall
CoreML::MilStoragePython::MilStoragePythonWriter::write_uint4_data
          (MilStoragePythonWriter *this,array_t<unsigned_char,_16> *data)

{
  _Head_base<0UL,_MILBlob::Blob::StorageWriter_*,_false> this_00;
  SpanSize<18446744073709551615UL> SVar1;
  uint64_t uVar2;
  size_t in_RCX;
  Util *this_01;
  pointer ptVar3;
  Span<const_unsigned_char,_18446744073709551615UL> unpackedValues;
  Span<const_unsigned_char,_18446744073709551615UL> span;
  Span<const_MILBlob::UInt4,_18446744073709551615UL> data_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> packedValues;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  this_00._M_head_impl =
       (this->m_writer)._M_t.
       super___uniq_ptr_impl<MILBlob::Blob::StorageWriter,_std::default_delete<MILBlob::Blob::StorageWriter>_>
       ._M_t.
       super__Tuple_impl<0UL,_MILBlob::Blob::StorageWriter_*,_std::default_delete<MILBlob::Blob::StorageWriter>_>
       .super__Head_base<0UL,_MILBlob::Blob::StorageWriter_*,_false>._M_head_impl;
  ptVar3 = (pointer)(data->super_array).super_buffer.super_object.super_handle.m_ptr[1].ob_refcnt;
  SVar1.m_size = pybind11::array::size(&data->super_array);
  if (SVar1.m_size == 0) {
    ptVar3 = (pointer)0x0;
  }
  unpackedValues.m_size.m_size = SVar1.m_size;
  unpackedValues.m_ptr = ptVar3;
  MILBlob::PackUInt8Span<MILBlob::UInt4>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,unpackedValues);
  SVar1.m_size = pybind11::array::size(&data->super_array);
  this_01 = (Util *)0x0;
  if (local_40._M_impl.super__Vector_impl_data._M_finish +
      -(long)local_40._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    this_01 = (Util *)local_40._M_impl.super__Vector_impl_data._M_start;
  }
  span.m_size.m_size = SVar1.m_size;
  span.m_ptr = local_40._M_impl.super__Vector_impl_data._M_finish +
               -(long)local_40._M_impl.super__Vector_impl_data._M_start;
  data_00 = MILBlob::Util::CastToBitSpan<const_MILBlob::UInt4,_const_unsigned_char,_true>
                      (this_01,span,in_RCX);
  uVar2 = MILBlob::Blob::StorageWriter::WriteData<MILBlob::UInt4>(this_00._M_head_impl,data_00);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
  return uVar2;
}

Assistant:

u_int64_t MilStoragePythonWriter::write_uint4_data(const py::array_t<uint8_t>& data) {
    return writeUnsignedSubByteData<MILBlob::UInt4>(*m_writer, data);
}